

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_selectable_symbol_text
                  (nk_context *ctx,nk_symbol_type sym,char *str,int len,nk_flags align,
                  nk_bool *value)

{
  nk_rect bounds_00;
  nk_widget_layout_states nVar1;
  undefined4 in_ECX;
  nk_flags *in_RDX;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_R8D;
  char *in_R9;
  nk_symbol_type in_stack_00000010;
  nk_style_selectable *in_stack_00000018;
  nk_input *in_stack_00000020;
  nk_user_font *in_stack_00000028;
  nk_rect bounds;
  nk_widget_layout_states state;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  nk_context *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  nk_bool *value_00;
  long lVar2;
  float in_stack_ffffffffffffffe8;
  nk_bool local_14;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) || (in_R9 == (char *)0x0)) {
    local_14 = 0;
  }
  else {
    lVar2 = *(long *)(in_RDI + 0x40d8);
    value_00 = *(nk_bool **)(lVar2 + 0xa8);
    nVar1 = nk_widget((nk_rect *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                      in_stack_ffffffffffffff90);
    if (nVar1 == NK_WIDGET_INVALID) {
      local_14 = 0;
    }
    else {
      bounds_00.y = (float)(int)in_RDI;
      bounds_00.w = (float)(int)((ulong)in_RDI >> 0x20);
      bounds_00.x = (float)in_ESI;
      bounds_00.h = in_stack_ffffffffffffffe8;
      local_14 = nk_do_selectable_symbol
                           (in_RDX,(nk_command_buffer *)CONCAT44(in_ECX,in_R8D),bounds_00,in_R9,
                            (int)((ulong)lVar2 >> 0x20),(nk_flags)lVar2,value_00,in_stack_00000010,
                            in_stack_00000018,in_stack_00000020,in_stack_00000028);
    }
  }
  return local_14;
}

Assistant:

NK_API nk_bool
nk_selectable_symbol_text(struct nk_context *ctx, enum nk_symbol_type sym,
const char *str, int len, nk_flags align, nk_bool *value)
{
struct nk_window *win;
struct nk_panel *layout;
const struct nk_input *in;
const struct nk_style *style;

enum nk_widget_layout_states state;
struct nk_rect bounds;

NK_ASSERT(ctx);
NK_ASSERT(value);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
if (!ctx || !ctx->current || !ctx->current->layout || !value)
return 0;

win = ctx->current;
layout = win->layout;
style = &ctx->style;

state = nk_widget(&bounds, ctx);
if (!state) return 0;
in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
return nk_do_selectable_symbol(&ctx->last_widget_state, &win->buffer, bounds,
str, len, align, value, sym, &style->selectable, in, style->font);
}